

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetryoperation.cpp
# Opt level: O0

void __thiscall
CIF::Symmetry::setOperation
          (Symmetry *this,int i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *factors)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_40 [8];
  SymmetryOperation temp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *factors_local;
  int i_local;
  Symmetry *this_local;
  
  temp.c = (double)factors;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58,factors);
  SymmetryOperation::SymmetryOperation((SymmetryOperation *)local_40,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (i == 0) {
    (this->xOperation).xf = (double)local_40;
    (this->xOperation).yf = temp.xf;
    (this->xOperation).zf = temp.yf;
    (this->xOperation).c = temp.zf;
  }
  else if (i == 1) {
    (this->yOperation).xf = (double)local_40;
    (this->yOperation).yf = temp.xf;
    (this->yOperation).zf = temp.yf;
    (this->yOperation).c = temp.zf;
  }
  else if (i == 2) {
    (this->zOperation).xf = (double)local_40;
    (this->zOperation).yf = temp.xf;
    (this->zOperation).zf = temp.yf;
    (this->zOperation).c = temp.zf;
  }
  return;
}

Assistant:

void Symmetry::setOperation(int i, std::vector<std::string> factors) {
        SymmetryOperation temp = SymmetryOperation(factors);

        if (i == 0)
            xOperation = temp;
        else if (i == 1)
            yOperation = temp;
        else if (i == 2)
            zOperation = temp;
        // TODO: else statement with error handling
    }